

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3BtreeIndexMoveto(BtCursor *pCur,UnpackedRecord *pIdxKey,int *pRes)

{
  uchar *puVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  KeyInfo *pKVar6;
  anon_union_8_2_94730112_for_u *paVar7;
  u8 *puVar8;
  BtCursor *pCur_00;
  ushort uVar9;
  int iVar10;
  byte *pbVar11;
  uchar *pBuf;
  long lVar12;
  char cVar13;
  ulong uVar14;
  undefined8 uVar15;
  u16 uVar16;
  int iVar17;
  int iVar18;
  i8 iVar19;
  i8 iVar20;
  uint uVar21;
  int iVar22;
  u32 amt;
  code *xRecordCompare;
  MemPage *pMVar23;
  
  pKVar6 = pIdxKey->pKeyInfo;
  xRecordCompare = sqlite3VdbeRecordCompare;
  if (pKVar6->nAllField < 0xe) {
    paVar7 = (anon_union_8_2_94730112_for_u *)pIdxKey->aMem;
    uVar9 = *(u16 *)((long)paVar7 + 0x14);
    if (*pKVar6->aSortFlags == 0) {
      iVar19 = '\x01';
      iVar20 = -1;
    }
    else {
      if ((*pKVar6->aSortFlags & 2) != 0) goto LAB_0014beb9;
      iVar19 = -1;
      iVar20 = '\x01';
    }
    pIdxKey->r1 = iVar20;
    pIdxKey->r2 = iVar19;
    if ((uVar9 & 4) == 0) {
      if (((uVar9 & 0x39) == 0) && (pKVar6->aColl[0] == (CollSeq *)0x0)) {
        pIdxKey->u = paVar7[1];
        pIdxKey->n = *(int *)(paVar7 + 2);
        xRecordCompare = vdbeRecordCompareString;
      }
    }
    else {
      pIdxKey->u = *paVar7;
      xRecordCompare = vdbeRecordCompareInt;
    }
  }
LAB_0014beb9:
  pIdxKey->errCode = '\0';
  if ((pCur->eState == '\0') &&
     (pCur_00 = (BtCursor *)pCur->pPage, *(char *)&pCur_00->pBtree != '\0')) {
    if (0 < (long)pCur->iPage) {
      lVar12 = 0;
      do {
        if (pCur->aiIdx[lVar12] < pCur->apPage[lVar12]->nCell) goto LAB_0014bec8;
        lVar12 = lVar12 + 1;
      } while (pCur->iPage != lVar12);
    }
    if (((*(ushort *)&pCur_00->pKey - 1 == (uint)pCur->ix) &&
        (iVar10 = indexCellCompare(pCur_00,(uint)pCur->ix,pIdxKey,xRecordCompare), iVar10 < 1)) &&
       (pIdxKey->errCode == '\0')) {
      *pRes = iVar10;
      return 0;
    }
    if ((('\0' < pCur->iPage) &&
        (iVar10 = indexCellCompare((BtCursor *)pCur->pPage,0,pIdxKey,xRecordCompare), iVar10 < 1))
       && (pIdxKey->errCode == '\0')) {
      pCur->curFlags = pCur->curFlags & 0xfb;
      pMVar23 = pCur->pPage;
      if (pMVar23->isInit == '\0') {
        uVar15 = 0x126c7;
LAB_0014c352:
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar15,
                    "0f80b798b3f4b81a7bb4233c58294edd0f1156f36b6ecf5ab8e83631d468778c");
        return 0xb;
      }
      goto LAB_0014beed;
    }
    pIdxKey->errCode = '\0';
  }
LAB_0014bec8:
  iVar10 = moveToRoot(pCur);
  if (iVar10 == 0x10) {
    *pRes = -1;
    return 0;
  }
  if (iVar10 != 0) {
    return iVar10;
  }
  pMVar23 = pCur->pPage;
LAB_0014beed:
  uVar9 = pMVar23->nCell;
LAB_0014bf10:
  iVar17 = uVar9 - 1;
  iVar22 = 0;
  iVar10 = iVar17;
  do {
    puVar8 = pMVar23->aDataOfst;
    iVar18 = iVar17 >> 1;
    uVar14 = (ulong)(CONCAT11(pMVar23->aCellIdx[(long)iVar17 & 0xfffffffffffffffeU],
                              pMVar23->aCellIdx[((long)iVar17 & 0xfffffffffffffffeU) + 1]) &
                    pMVar23->maskPage);
    pbVar11 = puVar8 + uVar14 + 1;
    bVar2 = puVar8[uVar14];
    uVar21 = (uint)bVar2;
    uVar16 = (u16)iVar18;
    if (pMVar23->max1bytePayload < bVar2) {
      if ((-1 < (char)*pbVar11) &&
         (uVar21 = (bVar2 & 0x7f) << 7 | (int)(char)*pbVar11, uVar21 <= pMVar23->maxLocal)) {
        pbVar11 = puVar8 + uVar14 + 2;
        goto LAB_0014c046;
      }
      (*pMVar23->xParseCell)(pMVar23,puVar8 + (uVar14 - pMVar23->childPtrSize),&pCur->info);
      uVar14 = (pCur->info).nKey;
      amt = (u32)uVar14;
      if (((int)amt < 2) ||
         (pCur->pBt->nPage < (uint)((uVar14 & 0xffffffff) / (ulong)pCur->pBt->usableSize))) {
        uVar15 = 0x1271e;
LAB_0014c2a6:
        sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",uVar15,
                    "0f80b798b3f4b81a7bb4233c58294edd0f1156f36b6ecf5ab8e83631d468778c");
        iVar17 = 0xb;
      }
      else {
        pBuf = (uchar *)sqlite3Malloc((ulong)(amt + 0x12));
        if (pBuf == (uchar *)0x0) {
          iVar17 = 7;
        }
        else {
          pCur->ix = uVar16;
          iVar17 = accessPayload(pCur,0,amt,pBuf,0);
          puVar1 = pBuf + (amt & 0x7fffffff);
          puVar1[0] = '\0';
          puVar1[1] = '\0';
          puVar1[2] = '\0';
          puVar1[3] = '\0';
          puVar1[4] = '\0';
          puVar1[5] = '\0';
          puVar1[6] = '\0';
          puVar1[7] = '\0';
          puVar1[8] = '\0';
          puVar1[9] = '\0';
          puVar1[10] = '\0';
          puVar1[0xb] = '\0';
          puVar1[0xc] = '\0';
          puVar1[0xd] = '\0';
          puVar1[0xe] = '\0';
          puVar1[0xf] = '\0';
          (pBuf + (ulong)(amt & 0x7fffffff) + 0x10)[0] = '\0';
          (pBuf + (ulong)(amt & 0x7fffffff) + 0x10)[1] = '\0';
          pCur->curFlags = pCur->curFlags & 0xfb;
          if (iVar17 == 0) {
            iVar17 = sqlite3VdbeRecordCompareWithSkip(amt,pBuf,pIdxKey,0);
            sqlite3_free(pBuf);
            goto LAB_0014c04f;
          }
          sqlite3_free(pBuf);
        }
      }
      goto LAB_0014c31e;
    }
LAB_0014c046:
    iVar17 = (*xRecordCompare)(uVar21,pbVar11,pIdxKey);
LAB_0014c04f:
    if (iVar17 < 0) {
      iVar22 = iVar18 + 1;
    }
    else {
      if (iVar17 == 0) {
        *pRes = 0;
        pCur->ix = uVar16;
        if (pIdxKey->errCode != '\0') {
          uVar15 = 0x1273e;
          goto LAB_0014c2a6;
        }
        goto LAB_0014c31c;
      }
      iVar10 = iVar18 + -1;
    }
    if (iVar10 < iVar22) break;
    iVar17 = iVar22 + iVar10;
  } while( true );
  if (pMVar23->leaf != '\0') {
    pCur->ix = uVar16;
    *pRes = iVar17;
LAB_0014c31c:
    iVar17 = 0;
    goto LAB_0014c31e;
  }
  if (iVar22 < (int)(uint)pMVar23->nCell) {
    lVar12 = (ulong)(CONCAT11(pMVar23->aCellIdx[(long)iVar22 * 2],
                              pMVar23->aCellIdx[(long)iVar22 * 2 + 1]) & pMVar23->maskPage) + 3;
  }
  else {
    lVar12 = (ulong)pMVar23->hdrOffset + 0xb;
  }
  pbVar11 = pMVar23->aData + lVar12;
  bVar2 = pbVar11[-3];
  bVar3 = pbVar11[-2];
  bVar4 = pbVar11[-1];
  bVar5 = *pbVar11;
  (pCur->info).nSize = 0;
  pCur->curFlags = pCur->curFlags & 0xf9;
  cVar13 = pCur->iPage;
  lVar12 = (long)cVar13;
  if (0x12 < lVar12) {
    uVar15 = 0x1275d;
    goto LAB_0014c352;
  }
  pCur->aiIdx[lVar12] = (u16)iVar22;
  pCur->apPage[lVar12] = pCur->pPage;
  pCur->ix = 0;
  pCur->iPage = cVar13 + '\x01';
  iVar17 = getAndInitPage(pCur->pBt,
                          (uint)bVar4 << 8 | (uint)bVar3 << 0x10 | (uint)bVar2 << 0x18 | (uint)bVar5
                          ,&pCur->pPage,(uint)pCur->curPagerFlags);
  if (iVar17 != 0) goto LAB_0014c188;
  pMVar23 = pCur->pPage;
  uVar9 = pMVar23->nCell;
  if ((uVar9 == 0) || (pMVar23->intKey != pCur->curIntKey)) {
    sqlite3PagerUnrefNotNull(pMVar23->pDbPage);
    sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x12768,
                "0f80b798b3f4b81a7bb4233c58294edd0f1156f36b6ecf5ab8e83631d468778c");
    iVar17 = 0xb;
LAB_0014c188:
    cVar13 = pCur->iPage + -1;
    pCur->iPage = cVar13;
    pCur->pPage = pCur->apPage[cVar13];
LAB_0014c31e:
    (pCur->info).nSize = 0;
    return iVar17;
  }
  goto LAB_0014bf10;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeIndexMoveto(
  BtCursor *pCur,          /* The cursor to be moved */
  UnpackedRecord *pIdxKey, /* Unpacked index key */
  int *pRes                /* Write search results here */
){
  int rc;
  RecordCompare xRecordCompare;

  assert( cursorOwnsBtShared(pCur) );
  assert( sqlite3_mutex_held(pCur->pBtree->db->mutex) );
  assert( pRes );
  assert( pCur->pKeyInfo!=0 );

#ifdef SQLITE_DEBUG
  pCur->pBtree->nSeek++;   /* Performance measurement during testing */
#endif

  xRecordCompare = sqlite3VdbeFindCompare(pIdxKey);
  pIdxKey->errCode = 0;
  assert( pIdxKey->default_rc==1
       || pIdxKey->default_rc==0
       || pIdxKey->default_rc==-1
  );


  /* Check to see if we can skip a lot of work.  Two cases:
  **
  **    (1) If the cursor is already pointing to the very last cell
  **        in the table and the pIdxKey search key is greater than or
  **        equal to that last cell, then no movement is required.
  **
  **    (2) If the cursor is on the last page of the table and the first
  **        cell on that last page is less than or equal to the pIdxKey
  **        search key, then we can start the search on the current page
  **        without needing to go back to root.
  */
  if( pCur->eState==CURSOR_VALID
   && pCur->pPage->leaf
   && cursorOnLastPage(pCur)
  ){
    int c;
    if( pCur->ix==pCur->pPage->nCell-1
     && (c = indexCellCompare(pCur, pCur->ix, pIdxKey, xRecordCompare))<=0
     && pIdxKey->errCode==SQLITE_OK
    ){
      *pRes = c;
      return SQLITE_OK;  /* Cursor already pointing at the correct spot */
    }
    if( pCur->iPage>0
     && indexCellCompare(pCur, 0, pIdxKey, xRecordCompare)<=0
     && pIdxKey->errCode==SQLITE_OK
    ){
      pCur->curFlags &= ~BTCF_ValidOvfl;
      if( !pCur->pPage->isInit ){
        return SQLITE_CORRUPT_BKPT;
      }
      goto bypass_moveto_root;  /* Start search on the current page */
    }
    pIdxKey->errCode = SQLITE_OK;
  }

  rc = moveToRoot(pCur);
  if( rc ){
    if( rc==SQLITE_EMPTY ){
      assert( pCur->pgnoRoot==0 || pCur->pPage->nCell==0 );
      *pRes = -1;
      return SQLITE_OK;
    }
    return rc;
  }

bypass_moveto_root:
  assert( pCur->pPage );
  assert( pCur->pPage->isInit );
  assert( pCur->eState==CURSOR_VALID );
  assert( pCur->pPage->nCell > 0 );
  assert( pCur->curIntKey==0 );
  assert( pIdxKey!=0 );
  for(;;){
    int lwr, upr, idx, c;
    Pgno chldPg;
    MemPage *pPage = pCur->pPage;
    u8 *pCell;                          /* Pointer to current cell in pPage */

    /* pPage->nCell must be greater than zero. If this is the root-page
    ** the cursor would have been INVALID above and this for(;;) loop
    ** not run. If this is not the root-page, then the moveToChild() routine
    ** would have already detected db corruption. Similarly, pPage must
    ** be the right kind (index or table) of b-tree page. Otherwise
    ** a moveToChild() or moveToRoot() call would have detected corruption.  */
    assert( pPage->nCell>0 );
    assert( pPage->intKey==0 );
    lwr = 0;
    upr = pPage->nCell-1;
    idx = upr>>1; /* idx = (lwr+upr)/2; */
    for(;;){
      int nCell;  /* Size of the pCell cell in bytes */
      pCell = findCellPastPtr(pPage, idx);

      /* The maximum supported page-size is 65536 bytes. This means that
      ** the maximum number of record bytes stored on an index B-Tree
      ** page is less than 16384 bytes and may be stored as a 2-byte
      ** varint. This information is used to attempt to avoid parsing
      ** the entire cell by checking for the cases where the record is
      ** stored entirely within the b-tree page by inspecting the first
      ** 2 bytes of the cell.
      */
      nCell = pCell[0];
      if( nCell<=pPage->max1bytePayload ){
        /* This branch runs if the record-size field of the cell is a
        ** single byte varint and the record fits entirely on the main
        ** b-tree page.  */
        testcase( pCell+nCell+1==pPage->aDataEnd );
        c = xRecordCompare(nCell, (void*)&pCell[1], pIdxKey);
      }else if( !(pCell[1] & 0x80)
        && (nCell = ((nCell&0x7f)<<7) + pCell[1])<=pPage->maxLocal
      ){
        /* The record-size field is a 2 byte varint and the record
        ** fits entirely on the main b-tree page.  */
        testcase( pCell+nCell+2==pPage->aDataEnd );
        c = xRecordCompare(nCell, (void*)&pCell[2], pIdxKey);
      }else{
        /* The record flows over onto one or more overflow pages. In
        ** this case the whole cell needs to be parsed, a buffer allocated
        ** and accessPayload() used to retrieve the record into the
        ** buffer before VdbeRecordCompare() can be called.
        **
        ** If the record is corrupt, the xRecordCompare routine may read
        ** up to two varints past the end of the buffer. An extra 18
        ** bytes of padding is allocated at the end of the buffer in
        ** case this happens.  */
        void *pCellKey;
        u8 * const pCellBody = pCell - pPage->childPtrSize;
        const int nOverrun = 18;  /* Size of the overrun padding */
        pPage->xParseCell(pPage, pCellBody, &pCur->info);
        nCell = (int)pCur->info.nKey;
        testcase( nCell<0 );   /* True if key size is 2^32 or more */
        testcase( nCell==0 );  /* Invalid key size:  0x80 0x80 0x00 */
        testcase( nCell==1 );  /* Invalid key size:  0x80 0x80 0x01 */
        testcase( nCell==2 );  /* Minimum legal index key size */
        if( nCell<2 || nCell/pCur->pBt->usableSize>pCur->pBt->nPage ){
          rc = SQLITE_CORRUPT_PAGE(pPage);
          goto moveto_index_finish;
        }
        pCellKey = sqlite3Malloc( nCell+nOverrun );
        if( pCellKey==0 ){
          rc = SQLITE_NOMEM_BKPT;
          goto moveto_index_finish;
        }
        pCur->ix = (u16)idx;
        rc = accessPayload(pCur, 0, nCell, (unsigned char*)pCellKey, 0);
        memset(((u8*)pCellKey)+nCell,0,nOverrun); /* Fix uninit warnings */
        pCur->curFlags &= ~BTCF_ValidOvfl;
        if( rc ){
          sqlite3_free(pCellKey);
          goto moveto_index_finish;
        }
        c = sqlite3VdbeRecordCompare(nCell, pCellKey, pIdxKey);
        sqlite3_free(pCellKey);
      }
      assert(
          (pIdxKey->errCode!=SQLITE_CORRUPT || c==0)
       && (pIdxKey->errCode!=SQLITE_NOMEM || pCur->pBtree->db->mallocFailed)
      );
      if( c<0 ){
        lwr = idx+1;
      }else if( c>0 ){
        upr = idx-1;
      }else{
        assert( c==0 );
        *pRes = 0;
        rc = SQLITE_OK;
        pCur->ix = (u16)idx;
        if( pIdxKey->errCode ) rc = SQLITE_CORRUPT_BKPT;
        goto moveto_index_finish;
      }
      if( lwr>upr ) break;
      assert( lwr+upr>=0 );
      idx = (lwr+upr)>>1;  /* idx = (lwr+upr)/2 */
    }
    assert( lwr==upr+1 || (pPage->intKey && !pPage->leaf) );
    assert( pPage->isInit );
    if( pPage->leaf ){
      assert( pCur->ix<pCur->pPage->nCell || CORRUPT_DB );
      pCur->ix = (u16)idx;
      *pRes = c;
      rc = SQLITE_OK;
      goto moveto_index_finish;
    }
    if( lwr>=pPage->nCell ){
      chldPg = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    }else{
      chldPg = get4byte(findCell(pPage, lwr));
    }

    /* This block is similar to an in-lined version of:
    **
    **    pCur->ix = (u16)lwr;
    **    rc = moveToChild(pCur, chldPg);
    **    if( rc ) break;
    */
    pCur->info.nSize = 0;
    pCur->curFlags &= ~(BTCF_ValidNKey|BTCF_ValidOvfl);
    if( pCur->iPage>=(BTCURSOR_MAX_DEPTH-1) ){
      return SQLITE_CORRUPT_BKPT;
    }
    pCur->aiIdx[pCur->iPage] = (u16)lwr;
    pCur->apPage[pCur->iPage] = pCur->pPage;
    pCur->ix = 0;
    pCur->iPage++;
    rc = getAndInitPage(pCur->pBt, chldPg, &pCur->pPage, pCur->curPagerFlags);
    if( rc==SQLITE_OK
     && (pCur->pPage->nCell<1 || pCur->pPage->intKey!=pCur->curIntKey)
    ){
      releasePage(pCur->pPage);
      rc = SQLITE_CORRUPT_PGNO(chldPg);
    }
    if( rc ){
      pCur->pPage = pCur->apPage[--pCur->iPage];
      break;
    }
    /*
    ***** End of in-lined moveToChild() call */
 }
moveto_index_finish:
  pCur->info.nSize = 0;
  assert( (pCur->curFlags & BTCF_ValidOvfl)==0 );
  return rc;
}